

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppq.cpp
# Opt level: O1

void __thiscall pg::PPQSolver::run(PPQSolver *this)

{
  bitset *this_00;
  bitset *this_01;
  Game *pGVar1;
  uint64_t *puVar2;
  uint64_t uVar3;
  char cVar4;
  size_t sVar5;
  int *piVar6;
  uint *puVar7;
  ostream *poVar8;
  Error *this_02;
  size_t sVar9;
  size_t sVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  _label_vertex local_48;
  bitset *local_38;
  
  this->iterations = 0;
  pGVar1 = (this->super_Solver).game;
  piVar6 = (int *)operator_new__(-(ulong)((ulong)pGVar1->n_vertices >> 0x3e != 0) |
                                 pGVar1->n_vertices << 2);
  this->str = piVar6;
  uVar13 = pGVar1->n_vertices;
  if (uVar13 != 0) {
    memset(piVar6,0xff,uVar13 * 4);
  }
  uVar12 = uVar13 * 4;
  if (0x3fffffffffffffff < uVar13) {
    uVar12 = 0xffffffffffffffff;
  }
  piVar6 = (int *)operator_new__(uVar12);
  this->r = piVar6;
  uVar13 = pGVar1->n_vertices;
  if (0 < (long)uVar13) {
    puVar2 = ((this->super_Solver).disabled)->_bits;
    uVar12 = 0;
    do {
      iVar11 = -1;
      if ((puVar2[uVar12 >> 6] >> (uVar12 & 0x3f) & 1) == 0) {
        iVar11 = pGVar1->_priority[uVar12];
      }
      piVar6[uVar12] = iVar11;
      uVar12 = uVar12 + 1;
    } while (uVar13 != uVar12);
  }
  uVar12 = uVar13 * 4;
  if (0x3fffffffffffffff < uVar13) {
    uVar12 = 0xffffffffffffffff;
  }
  piVar6 = (int *)operator_new__(uVar12);
  this->u = piVar6;
  uVar13 = pGVar1->n_vertices;
  if (uVar13 != 0) {
    memset(piVar6,0xff,uVar13 * 4);
  }
  (this->Q).pointer = 0;
  puVar7 = (this->Q).queue;
  if (puVar7 != (uint *)0x0) {
    operator_delete__(puVar7);
  }
  puVar7 = (uint *)operator_new__((uVar13 & 0xffffffff) << 2);
  (this->Q).queue = puVar7;
  bitset::resize(&this->L,((this->super_Solver).game)->n_vertices);
  bitset::resize(&this->R,((this->super_Solver).game)->n_vertices);
  bitset::resize(&this->U,((this->super_Solver).game)->n_vertices);
  local_38 = &this->W0;
  bitset::resize(local_38,((this->super_Solver).game)->n_vertices);
  this_01 = &this->W1;
  bitset::resize(this_01,((this->super_Solver).game)->n_vertices);
  this_00 = &this->G;
  bitset::resize(this_00,((this->super_Solver).game)->n_vertices);
  bitset::operator=(this_00,(this->super_Solver).disabled);
  uVar13 = (this->G)._bitssize;
  if (uVar13 != 0) {
    puVar2 = this_00->_bits;
    uVar12 = 0;
    do {
      puVar2[uVar12] = ~puVar2[uVar12];
      uVar12 = uVar12 + 1;
      uVar13 = (this->G)._bitssize;
    } while (uVar12 < uVar13);
  }
  uVar12 = (this->G)._size & 0x3f;
  if (uVar12 != 0) {
    this_00->_bits[uVar13 - 1] = this_00->_bits[uVar13 - 1] & ~(-1L << uVar12);
  }
  puVar2 = (this->G)._bits;
  sVar9 = (this->G)._bitssize;
  sVar5 = 0;
  do {
    sVar10 = sVar5;
    if (sVar9 == sVar10) goto LAB_00161714;
    sVar5 = sVar10 + 1;
  } while (puVar2[sVar10] == 0);
  if (sVar9 != sVar10) {
    iVar11 = (int)((this->super_Solver).game)->n_vertices;
    uVar13 = 0xffffffffffffffff;
    if (sVar9 != 0) {
      lVar14 = sVar9 * -0x40;
      do {
        lVar14 = lVar14 + 0x40;
        uVar3 = puVar2[sVar9 - 1];
        if (uVar3 != 0) {
          uVar13 = LZCOUNT(uVar3) - lVar14 ^ 0x3f;
          break;
        }
        sVar9 = sVar9 - 1;
      } while (sVar9 != 0);
    }
    solve(this,iVar11 + -1,this->r[uVar13],0x7fffffff,iVar11,iVar11);
  }
LAB_00161714:
  if ((1 < (this->super_Solver).trace) && (0 < ((this->super_Solver).game)->n_vertices)) {
    uVar13 = 0;
    do {
      uVar12 = uVar13 >> 6;
      if ((((this->super_Solver).disabled)->_bits[uVar12] >> (uVar13 & 0x3f) & 1) == 0) {
        uVar15 = 1L << (uVar13 & 0x3f);
        poVar8 = (this->super_Solver).logger;
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"vertex ",7);
        local_48.g = (this->super_Solver).game;
        local_48.v = (int)uVar13;
        poVar8 = operator<<(poVar8,&local_48);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," is solved by",0xd);
        if ((((this->W0)._bits[uVar12] & uVar15) != 0) &&
           (std::__ostream_insert<char,std::char_traits<char>>
                      ((this->super_Solver).logger," even",5),
           ((((this->super_Solver).game)->_owner)._bits[uVar12] >> (uVar13 & 0x3f) & 1) == 0)) {
          std::__ostream_insert<char,std::char_traits<char>>((this->super_Solver).logger," (",2);
          poVar8 = (this->super_Solver).logger;
          if (this->str[uVar13] == -1) {
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"-1",2);
          }
          else {
            local_48.v = this->str[uVar13];
            local_48.g = (this->super_Solver).game;
            operator<<(poVar8,&local_48);
          }
          std::__ostream_insert<char,std::char_traits<char>>((this->super_Solver).logger,")",1);
        }
        if (((this_01->_bits[uVar12] & uVar15) != 0) &&
           (std::__ostream_insert<char,std::char_traits<char>>((this->super_Solver).logger," odd",4)
           , ((((this->super_Solver).game)->_owner)._bits[uVar12] >> (uVar13 & 0x3f) & 1) != 0)) {
          std::__ostream_insert<char,std::char_traits<char>>((this->super_Solver).logger," (",2);
          poVar8 = (this->super_Solver).logger;
          if (this->str[uVar13] == -1) {
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"-1",2);
          }
          else {
            local_48.v = this->str[uVar13];
            local_48.g = (this->super_Solver).game;
            operator<<(poVar8,&local_48);
          }
          std::__ostream_insert<char,std::char_traits<char>>((this->super_Solver).logger,")",1);
        }
        poVar8 = (this->super_Solver).logger;
        cVar4 = (char)poVar8;
        std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + cVar4);
        std::ostream::put(cVar4);
        std::ostream::flush();
      }
      uVar13 = uVar13 + 1;
    } while ((long)uVar13 < ((this->super_Solver).game)->n_vertices);
  }
  if (0 < ((this->super_Solver).game)->n_vertices) {
    uVar13 = 0;
    do {
      uVar12 = uVar13 >> 6;
      if ((((this->super_Solver).disabled)->_bits[uVar12] >> (uVar13 & 0x3f) & 1) == 0) {
        uVar15 = 1L << (uVar13 & 0x3f);
        if ((local_38->_bits[uVar12] & uVar15) != 0) {
          Oink::solve((this->super_Solver).oink,(int)uVar13,0,this->str[uVar13]);
        }
        if ((this_01->_bits[uVar12] & uVar15) != 0) {
          Oink::solve((this->super_Solver).oink,(int)uVar13,1,this->str[uVar13]);
        }
      }
      uVar13 = uVar13 + 1;
    } while ((long)uVar13 < ((this->super_Solver).game)->n_vertices);
  }
  poVar8 = (this->super_Solver).logger;
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"solved with ",0xc);
  poVar8 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," iterations.",0xc);
  std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  uVar13 = ((this->super_Solver).game)->n_vertices;
  if (0 < (long)uVar13) {
    uVar12 = 0;
    do {
      if ((((this->super_Solver).disabled)->_bits[uVar12 >> 6] >> (uVar12 & 0x3f) & 1) == 0) {
        this_02 = (Error *)__cxa_allocate_exception(0x40);
        Error::Error(this_02,"search was incomplete!",
                     "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/ppq.cpp"
                     ,0x252);
        __cxa_throw(this_02,&Error::typeinfo,Error::~Error);
      }
      uVar12 = uVar12 + 1;
    } while (uVar13 != uVar12);
  }
  if (this->str != (int *)0x0) {
    operator_delete__(this->str);
  }
  return;
}

Assistant:

void
PPQSolver::run()
{
    iterations = 0;

    str = new int[nodecount()];
    std::fill(str, str+nodecount(), -1);

    r = new int[nodecount()];
    for (int v=0; v<nodecount(); v++) {
        if (!disabled[v]) r[v] = priority(v);
        else r[v] = -1;
    }

    u = new int[nodecount()];
    std::fill(u, u+nodecount(), -1);

    Q.resize(nodecount());
    L.resize(nodecount());
    R.resize(nodecount());
    U.resize(nodecount());

    W0.resize(nodecount());
    W1.resize(nodecount());
    
    G.resize(nodecount()); 
    G = disabled;
    G.flip();

    if (G.any()) {
        solve(nodecount()-1, r[G.find_last()], INT_MAX, nodecount(), nodecount()); // caller has INT_MAX priority...
    }

#ifndef NDEBUG
    if (trace >= 2) {
        for (int v=0; v<nodecount(); v++) {
            if (disabled[v]) continue;
            logger << "vertex " << label_vertex(v) << " is solved by";
            if (W0[v]) {
                logger << " even";
                if (owner(v) == 0) {
                    logger << " (";
                    if (str[v] == -1) logger << "-1";
                    else logger << label_vertex(str[v]);
                    logger << ")";
                }
            }
            if (W1[v]) {
                logger << " odd";
                if (owner(v) == 1) {
                    logger << " (";
                    if (str[v] == -1) logger << "-1";
                    else logger << label_vertex(str[v]);
                    logger << ")";
                }
            }
            logger << std::endl;
        }
    }
#endif

    for (int v=0; v<nodecount(); v++) {
        if (disabled[v]) continue;
        if (W0[v]) Solver::solve(v, 0, str[v]);
        if (W1[v]) Solver::solve(v, 1, str[v]);
    }

    logger << "solved with " << iterations << " iterations." << std::endl;

    // check if actually all solved
#ifndef NDEBUG
    for (int i=0; i<nodecount(); i++) {
        if (!disabled[i]) { THROW_ERROR("search was incomplete!"); }
    }
#endif

    delete[] str;
}